

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall
crnlib::symbol_codec::encode(symbol_codec *this,uint sym,adaptive_arith_data_model *model)

{
  uint uVar1;
  uint uVar2;
  uint *in_RDX;
  uint in_ESI;
  uint bit;
  uint bitmask;
  uint node;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  
  i = 1;
  uVar1 = *in_RDX;
  do {
    uVar1 = uVar1 >> 1;
    uVar2 = in_ESI & uVar1;
    vector<crnlib::adaptive_bit_model>::operator[]
              ((vector<crnlib::adaptive_bit_model> *)(in_RDX + 2),i);
    encode((symbol_codec *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint)((ulong)in_RDX >> 0x20),
           (adaptive_bit_model *)CONCAT44(i,uVar1),false);
    i = i * 2 + (uint)(uVar2 != 0);
  } while (1 < uVar1);
  return;
}

Assistant:

void symbol_codec::encode(uint sym, adaptive_arith_data_model& model) {
  uint node = 1;

  uint bitmask = model.m_total_syms;

  do {
    bitmask >>= 1;

    uint bit = (sym & bitmask) ? 1 : 0;
    encode(bit, model.m_probs[node]);
    node = (node << 1) + bit;

  } while (bitmask > 1);
}